

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.h
# Opt level: O2

void __thiscall cmConfigureFileCommand::cmConfigureFileCommand(cmConfigureFileCommand *this)

{
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmConfigureFileCommand_0064d7d8;
  cmNewLineStyle::cmNewLineStyle(&this->NewLineStyle);
  (this->InputFile)._M_dataplus._M_p = (pointer)&(this->InputFile).field_2;
  (this->InputFile)._M_string_length = 0;
  (this->InputFile).field_2._M_local_buf[0] = '\0';
  (this->OutputFile)._M_dataplus._M_p = (pointer)&(this->OutputFile).field_2;
  (this->OutputFile)._M_string_length = 0;
  (this->OutputFile).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmConfigureFileCommand; }